

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O3

Vec_Int_t * Saig_ManComputeSwitchProbs(Aig_Man_t *pAig,int nFrames,int nPref,int fProbOne)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  Gia_Man_t *pGia;
  Vec_Int_t *__ptr;
  Vec_Int_t *pVVar5;
  int *__s;
  ulong uVar6;
  uint uVar7;
  
  pGia = Gia_ManFromAigSwitch(pAig);
  __ptr = Gia_ManComputeSwitchProbs(pGia,nFrames,nPref,fProbOne);
  pVVar2 = pAig->vObjs;
  uVar1 = pVVar2->nSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar7 = uVar1;
  }
  pVVar5->nCap = uVar7;
  if (uVar7 == 0) {
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = uVar1;
  }
  else {
    __s = (int *)malloc((long)(int)uVar7 << 2);
    pVVar5->pArray = __s;
    pVVar5->nSize = uVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar1 << 2);
      goto LAB_002317e2;
    }
  }
  __s = (int *)0x0;
LAB_002317e2:
  if (0 < (int)uVar1) {
    ppvVar3 = pVVar2->pArray;
    uVar6 = 0;
    do {
      pvVar4 = ppvVar3[uVar6];
      if (pvVar4 != (void *)0x0) {
        uVar7 = *(uint *)((long)pvVar4 + 0x28);
        if ((int)uVar7 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar7 = uVar7 >> 1;
        if (__ptr->nSize <= (int)uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (uVar1 <= uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar6] = __ptr->pArray[uVar7];
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar1);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  Gia_ManStop(pGia);
  return pVVar5;
}

Assistant:

Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * pAig, int nFrames, int nPref, int fProbOne )
{
    Vec_Int_t * vSwitching, * vResult;
    Gia_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    // translate AIG into the intermediate form (takes care of choices if present!)
    p = Gia_ManFromAigSwitch( pAig );
    // perform the computation of switching activity
    vSwitching = Gia_ManComputeSwitchProbs( p, nFrames, nPref, fProbOne );
    // transfer the computed result to the original AIG
    vResult = Vec_IntStart( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( Aig_ObjIsCo(pObj) )
//            printf( "%d=%f\n", i, Abc_Int2Float( Vec_IntEntry(vSwitching, Abc_Lit2Var(pObj->iData)) ) );
        Vec_IntWriteEntry( vResult, i, Vec_IntEntry(vSwitching, Abc_Lit2Var(pObj->iData)) );
    }
    // delete intermediate results
    Vec_IntFree( vSwitching );
    Gia_ManStop( p );
    return vResult;
}